

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O0

uint aom_masked_sad_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,
                        uint8_t *second_pred,uint8_t *msk,int msk_stride,int invert_mask,int m,int n
                        )

{
  undefined4 in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  uint sad;
  int in_stack_00000064;
  uint8_t *in_stack_00000068;
  int in_stack_00000074;
  undefined4 in_stack_0000007c;
  int in_stack_000000a4;
  uint8_t *in_stack_000000a8;
  int in_stack_000000b4;
  uint8_t *in_stack_000000b8;
  int in_stack_000000c4;
  uint8_t *in_stack_000000c8;
  int in_stack_000001a4;
  uint8_t *in_stack_000001a8;
  int in_stack_000001b4;
  uint8_t *in_stack_000001b8;
  int in_stack_000001c4;
  uint8_t *in_stack_000001c8;
  uint8_t *in_stack_00000360;
  int in_stack_00000368;
  int in_stack_00000370;
  uint8_t *in_stack_000003e0;
  int in_stack_000003e8;
  int in_stack_000003f0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  undefined4 local_3c;
  
  if (in_stack_00000010 == 0) {
    if (in_stack_00000018 == 4) {
      local_3c = aom_masked_sad4xh_ssse3
                           ((uint8_t *)CONCAT44(in_stack_0000007c,invert_mask),in_stack_00000074,
                            in_stack_00000068,in_stack_00000064,src,src_stride,in_stack_00000360,
                            in_stack_00000368,in_stack_00000370);
    }
    else if (in_stack_00000018 == 8) {
      local_3c = aom_masked_sad8xh_ssse3
                           (in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,in_stack_000000b4,
                            in_stack_000000a8,in_stack_000000a4,in_stack_000003e0,in_stack_000003e8,
                            in_stack_000003f0);
    }
    else if (in_stack_00000018 == 0x10) {
      local_3c = masked_sad16xh_avx2(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,
                                     in_stack_000001b4,in_stack_000001a8,in_stack_000001a4,
                                     (uint8_t *)
                                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_00000008),
                                     in_stack_00000020,in_stack_ffffffffffffffb0);
    }
    else {
      local_3c = masked_sad32xh_avx2(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,
                                     in_stack_000001b4,in_stack_000001a8,in_stack_000001a4,
                                     (uint8_t *)
                                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_00000008),
                                     in_stack_00000018,in_stack_00000020,in_stack_ffffffffffffffb8);
    }
  }
  else if (in_stack_00000018 == 4) {
    local_3c = aom_masked_sad4xh_ssse3
                         ((uint8_t *)CONCAT44(in_stack_0000007c,invert_mask),in_stack_00000074,
                          in_stack_00000068,in_stack_00000064,src,src_stride,in_stack_00000360,
                          in_stack_00000368,in_stack_00000370);
  }
  else if (in_stack_00000018 == 8) {
    local_3c = aom_masked_sad8xh_ssse3
                         (in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,in_stack_000000b4,
                          in_stack_000000a8,in_stack_000000a4,in_stack_000003e0,in_stack_000003e8,
                          in_stack_000003f0);
  }
  else if (in_stack_00000018 == 0x10) {
    local_3c = masked_sad16xh_avx2(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,
                                   in_stack_000001b4,in_stack_000001a8,in_stack_000001a4,
                                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_00000008),
                                   in_stack_00000020,in_stack_ffffffffffffffb0);
  }
  else {
    local_3c = masked_sad32xh_avx2(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,
                                   in_stack_000001b4,in_stack_000001a8,in_stack_000001a4,
                                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_00000008),
                                   in_stack_00000018,in_stack_00000020,in_stack_ffffffffffffffb8);
  }
  return local_3c;
}

Assistant:

static inline unsigned int aom_masked_sad_avx2(
    const uint8_t *src, int src_stride, const uint8_t *ref, int ref_stride,
    const uint8_t *second_pred, const uint8_t *msk, int msk_stride,
    int invert_mask, int m, int n) {
  unsigned int sad;
  if (!invert_mask) {
    switch (m) {
      case 4:
        sad = aom_masked_sad4xh_ssse3(src, src_stride, ref, ref_stride,
                                      second_pred, m, msk, msk_stride, n);
        break;
      case 8:
        sad = aom_masked_sad8xh_ssse3(src, src_stride, ref, ref_stride,
                                      second_pred, m, msk, msk_stride, n);
        break;
      case 16:
        sad = masked_sad16xh_avx2(src, src_stride, ref, ref_stride, second_pred,
                                  m, msk, msk_stride, n);
        break;
      default:
        sad = masked_sad32xh_avx2(src, src_stride, ref, ref_stride, second_pred,
                                  m, msk, msk_stride, m, n);
        break;
    }
  } else {
    switch (m) {
      case 4:
        sad = aom_masked_sad4xh_ssse3(src, src_stride, second_pred, m, ref,
                                      ref_stride, msk, msk_stride, n);
        break;
      case 8:
        sad = aom_masked_sad8xh_ssse3(src, src_stride, second_pred, m, ref,
                                      ref_stride, msk, msk_stride, n);
        break;
      case 16:
        sad = masked_sad16xh_avx2(src, src_stride, second_pred, m, ref,
                                  ref_stride, msk, msk_stride, n);
        break;
      default:
        sad = masked_sad32xh_avx2(src, src_stride, second_pred, m, ref,
                                  ref_stride, msk, msk_stride, m, n);
        break;
    }
  }
  return sad;
}